

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QCommonArrayOps<QCss::Declaration>::growAppend
          (QCommonArrayOps<QCss::Declaration> *this,Declaration *b,Declaration *e)

{
  qsizetype *pqVar1;
  Declaration *pDVar2;
  DeclarationData *pDVar3;
  Declaration *pDVar4;
  Declaration **data;
  QArrayDataPointer<QCss::Declaration> *old;
  long lVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<QCss::Declaration> local_48;
  Declaration *local_30;
  long local_28;
  
  old = &local_48;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = b;
  if (b != e) {
    lVar5 = (long)e - (long)b;
    local_48.d = (Data *)0x0;
    local_48.ptr = (Declaration *)0x0;
    local_48.size = 0;
    pDVar2 = (this->super_Type).super_QGenericArrayOps<QCss::Declaration>.
             super_QArrayDataPointer<QCss::Declaration>.ptr;
    if ((b < pDVar2) ||
       (pDVar2 + (this->super_Type).super_QGenericArrayOps<QCss::Declaration>.
                 super_QArrayDataPointer<QCss::Declaration>.size <= b)) {
      data = (Declaration **)0x0;
      old = (QArrayDataPointer<QCss::Declaration> *)0x0;
    }
    else {
      data = &local_30;
    }
    QArrayDataPointer<QCss::Declaration>::detachAndGrow
              ((QArrayDataPointer<QCss::Declaration> *)this,GrowsAtEnd,lVar5 >> 3,data,old);
    if ((e != b) && (0 < lVar5)) {
      pDVar2 = (this->super_Type).super_QGenericArrayOps<QCss::Declaration>.
               super_QArrayDataPointer<QCss::Declaration>.ptr;
      pDVar4 = local_30;
      do {
        pDVar3 = (pDVar4->d).d.ptr;
        pDVar2[(this->super_Type).super_QGenericArrayOps<QCss::Declaration>.
               super_QArrayDataPointer<QCss::Declaration>.size].d.d.ptr = pDVar3;
        if (pDVar3 != (DeclarationData *)0x0) {
          LOCK();
          (pDVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value = (Type)((int)(pDVar3->super_QSharedData).ref.super_QAtomicInteger<int>.
                                 super_QBasicAtomicInteger<int>._q_value + 1);
          UNLOCK();
        }
        pDVar4 = pDVar4 + 1;
        pqVar1 = &(this->super_Type).super_QGenericArrayOps<QCss::Declaration>.
                  super_QArrayDataPointer<QCss::Declaration>.size;
        *pqVar1 = *pqVar1 + 1;
      } while (pDVar4 < (Declaration *)(lVar5 + (long)local_30));
    }
    QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }